

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Util.hpp
# Opt level: O2

int __thiscall Centaurus::ATNPath::count(ATNPath *this,Identifier *id,int index)

{
  __normal_iterator<const_std::pair<Centaurus::Identifier,_int>_*,_std::vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>_>
  __first;
  __normal_iterator<const_std::pair<Centaurus::Identifier,_int>_*,_std::vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>_>
  __last;
  difference_type dVar1;
  Identifier local_50;
  int local_28;
  
  __first._M_current =
       (this->
       super_vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
       ).
       super__Vector_base<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  __last._M_current =
       (this->
       super_vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
       ).
       super__Vector_base<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  Identifier::Identifier(&local_50,id);
  local_28 = index;
  dVar1 = std::
          __count_if<__gnu_cxx::__normal_iterator<std::pair<Centaurus::Identifier,int>const*,std::vector<std::pair<Centaurus::Identifier,int>,std::allocator<std::pair<Centaurus::Identifier,int>>>>,__gnu_cxx::__ops::_Iter_equals_val<std::pair<Centaurus::Identifier,int>const>>
                    (__first,__last,(pair<Centaurus::Identifier,_int> *)&local_50);
  Identifier::~Identifier(&local_50);
  return (int)dVar1;
}

Assistant:

int count(const Identifier& id, int index) const
    {
        return std::count(cbegin(), cend(), std::pair<Identifier, int>(id, index));
    }